

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall QGraphicsScenePrivate::addView(QGraphicsScenePrivate *this,QGraphicsView *view)

{
  QWidget *this_00;
  long in_FS_OFFSET;
  piter local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QGraphicsView_*>::append(&this->views,view);
  local_28 = (piter)QHash<Qt::GestureType,_int>::constBegin(&this->grabbedGestures);
  while ((local_28.d != (Data<QHashPrivate::Node<Qt::GestureType,_int>_> *)0x0 ||
         (local_28.bucket != 0))) {
    this_00 = QAbstractScrollArea::viewport((QAbstractScrollArea *)view);
    QWidget::grabGesture
              (this_00,*(GestureType *)
                        (local_28.d)->spans[local_28.bucket >> 7].entries
                        [(local_28.d)->spans[local_28.bucket >> 7].offsets
                         [(uint)local_28.bucket & 0x7f]].storage.data,(GestureFlags)0x0);
    QHashPrivate::iterator<QHashPrivate::Node<Qt::GestureType,_int>_>::operator++(&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::addView(QGraphicsView *view)
{
    views << view;
#ifndef QT_NO_GESTURES
    for (auto it = grabbedGestures.constBegin();
              it != grabbedGestures.constEnd(); ++it)
        view->viewport()->grabGesture(it.key());
#endif
}